

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

string * underscores_to_initial_caps(string *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  int __c;
  bool bVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (name->_M_string_length != 0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    bVar5 = true;
    uVar3 = 0;
    uVar4 = 1;
    do {
      __c = (int)pcVar1[uVar3];
      bVar2 = true;
      if (__c != 0x5f) {
        if (bVar5) {
          toupper(__c);
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar2 = false;
        }
        else {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar2 = bVar5;
        }
      }
      bVar5 = bVar2;
      bVar2 = uVar4 < name->_M_string_length;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string underscores_to_initial_caps(string name) {
  string ret;
  const char* tmp = name.c_str();
  bool uppercase_next = true;

  for (unsigned int i = 0; i < name.length(); i++) {
    char c = tmp[i];
    if (c == '_') {
      uppercase_next = true;
    } else {
      if (uppercase_next) {
        ret += toupper(c);
        uppercase_next = false;
      } else {
        ret += c;
      }
    }
  }

  return ret;
}